

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::StmtBlock::set_child(StmtBlock *this,uint64_t index,shared_ptr<kratos::Stmt> *stmt)

{
  size_type sVar1;
  reference this_00;
  element_type *peVar2;
  shared_ptr<kratos::Stmt> *stmt_local;
  uint64_t index_local;
  StmtBlock *this_local;
  
  sVar1 = std::
          vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
          size(&this->stmts_);
  if (index < sVar1) {
    this_00 = std::
              vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              ::operator[](&this->stmts_,index);
    std::shared_ptr<kratos::Stmt>::operator=(this_00,stmt);
    peVar2 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)stmt);
    (*(peVar2->super_IRNode)._vptr_IRNode[7])(peVar2,this);
  }
  return;
}

Assistant:

void StmtBlock::set_child(uint64_t index, const std::shared_ptr<Stmt> &stmt) {
    if (index < stmts_.size()) {
        stmts_[index] = stmt;
        stmt->set_parent(this);
    }
}